

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O2

int pztopology::TPZLine::GetTransformId(int side,TPZVec<long> *id)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = 0;
  if (1 < (uint)side) {
    if (side == 2) {
      return (int)(id->fStore[1] <= *id->fStore);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Wrong input parameter");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPZLine::GetTransformId(const int side, const TPZVec<int64_t> &id)
	{
		switch (side) {
			case 0:
			case 1:
				return 0;
				break;
			case 2:
				return id[0] < id[1] ? 0 : 1;
			default:
				break;
		}
		LOGPZ_ERROR(logger,"Wrong input parameter")
		return -1;
	}